

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O2

uint8 * rw::d3d::rasterLock(Raster *raster,int32 level,int32 lockMode)

{
  long lVar1;
  undefined8 uVar2;
  uint8 *puVar3;
  long lVar4;
  
  if ((raster->privateFlags & 6U) == 0) {
    lVar4 = (long)nativeRasterOffset;
    lVar1 = *(long *)((long)&raster->platform + lVar4);
    puVar3 = *(uint8 **)(lVar1 + 0x18 + (long)level * 0x18);
    raster->pixels = puVar3;
    uVar2 = *(undefined8 *)(lVar1 + 8 + (long)level * 0x18);
    raster->width = (int)uVar2;
    raster->height = (int)((ulong)uVar2 >> 0x20);
    raster->stride = (int)uVar2 * *(int *)((long)&raster->depth + lVar4);
    if ((lockMode & 3U) != 0) {
      raster->privateFlags =
           raster->privateFlags |
           (uint)((byte)(((byte)lockMode & 2) << 5 | (byte)lockMode << 7) >> 5);
      return puVar3;
    }
  }
  else {
    puVar3 = (uint8 *)0x0;
  }
  return puVar3;
}

Assistant:

uint8*
rasterLock(Raster *raster, int32 level, int32 lockMode)
{
	D3dRaster *natras = GETD3DRASTEREXT(raster);

	// check if already locked
	if(raster->privateFlags & (Raster::PRIVATELOCK_READ|Raster::PRIVATELOCK_WRITE))
		return nil;

#ifdef RW_D3D9
	DWORD flags = D3DLOCK_NOSYSLOCK;
	if(lockMode & Raster::LOCKREAD)
		flags |= D3DLOCK_READONLY | D3DLOCK_NO_DIRTY_UPDATE;
	IDirect3DTexture9 *tex = (IDirect3DTexture9*)natras->texture;
	IDirect3DSurface9 *surf, *rt;
	D3DLOCKED_RECT lr;

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE: {
		tex->GetSurfaceLevel(level, &surf);
		natras->lockedSurf = surf;
		HRESULT res = surf->LockRect(&lr, 0, flags);
		assert(res == D3D_OK);
		break;
		}

	case Raster::CAMERATEXTURE:
	case Raster::CAMERA: {
		if(lockMode & Raster::PRIVATELOCK_WRITE)
			assert(0 && "can't lock framebuffer for writing");
		if(raster->type == Raster::CAMERA)
			rt = d3d9Globals.defaultRenderTarget;
		else
			tex->GetSurfaceLevel(level, &rt);
		D3DSURFACE_DESC desc;
		rt->GetDesc(&desc);
		HRESULT res = d3ddevice->CreateOffscreenPlainSurface(desc.Width, desc.Height, desc.Format, D3DPOOL_SYSTEMMEM, &surf, nil);
		if(res != D3D_OK)
			return nil;
		d3ddevice->GetRenderTargetData(rt, surf);
		natras->lockedSurf = surf;
		res = surf->LockRect(&lr, 0, flags);
		assert(res == D3D_OK);
		break;
		}

	default:
		assert(0 && "can't lock this raster type (yet)");
	}

	raster->pixels = (uint8*)lr.pBits;
	raster->width >>= level;
	raster->height >>= level;
	raster->stride = lr.Pitch;
	if(raster->width == 0) raster->width = 1;
	if(raster->height == 0) raster->height = 1;
#else
	RasterLevels *levels = (RasterLevels*)natras->texture;
	raster->pixels = levels->levels[level].data;
	raster->width = levels->levels[level].width;
	raster->height = levels->levels[level].height;
	raster->stride = raster->width*natras->bpp;
#endif
	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE;

	return raster->pixels;
}